

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBuffer.c
# Opt level: O1

void Abc_BufCreateEdges(Buf_Man_t *p,Abc_Obj_t *pObj)

{
  Vec_Int_t *p_00;
  int iVar1;
  int Entry;
  Mio_Gate_t *pGate;
  float fVar2;
  
  if ((*(uint *)&pObj->field_0x14 & 0xf) - 5 < 0xfffffffe) {
    pGate = (Mio_Gate_t *)(pObj->field_5).pData;
  }
  else {
    pGate = (Mio_Gate_t *)0x0;
  }
  iVar1 = pObj->Id;
  if ((-1 < (long)iVar1) && (iVar1 < p->vOffsets->nSize)) {
    p->vOffsets->pArray[iVar1] = p->vEdges->nSize;
    if (0 < (pObj->vFanins).nSize) {
      iVar1 = 0;
      do {
        p_00 = p->vEdges;
        Entry = 0;
        if (pGate != (Mio_Gate_t *)0x0) {
          fVar2 = Mio_GateReadPinDelay(pGate,iVar1);
          Entry = (int)((fVar2 * 1000.0) / p->DelayInv);
        }
        Vec_IntPush(p_00,Entry);
        iVar1 = iVar1 + 1;
      } while (iVar1 < (pObj->vFanins).nSize);
    }
    return;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
}

Assistant:

void Abc_BufCreateEdges( Buf_Man_t * p, Abc_Obj_t * pObj )
{
    int k;
    Mio_Gate_t * pGate = Abc_ObjIsCo(pObj) ? NULL : (Mio_Gate_t *)pObj->pData;
    Vec_IntWriteEntry( p->vOffsets, Abc_ObjId(pObj), Vec_IntSize(p->vEdges) );
    for ( k = 0; k < Abc_ObjFaninNum(pObj); k++ )
        Vec_IntPush( p->vEdges, pGate ? (int)(1.0 * BUF_SCALE * Mio_GateReadPinDelay(pGate, k) / p->DelayInv) : 0 );
}